

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::SeparateShaderTest
          (SeparateShaderTest *this,Context *ctx,string *name,string *description,int iterations,
          TestParams *params,TestFunc testFunc)

{
  Random *rnd;
  TestLog *log;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  DataType DVar6;
  BindingKind BVar7;
  VaryingInterpolation VVar8;
  VaryingInterpolation VVar9;
  int iVar10;
  uint uVar11;
  deBool dVar12;
  deUint32 dVar13;
  DataType DVar14;
  deUint32 dVar15;
  Interpolation interpolation_;
  Interpolation interpolation__00;
  int iVar16;
  undefined4 extraout_var;
  char *pcVar17;
  int location_;
  bool bVar18;
  bool bVar19;
  undefined8 in_stack_00000010;
  string ndxStr;
  string frgName;
  string vtxName;
  VarType varType;
  BindingKind local_26c;
  int local_254;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  VarType local_1d8;
  Layout local_1bc;
  undefined1 local_1a8 [32];
  VarType local_188;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [2];
  ios_base local_138 [264];
  
  tcu::TestCase::TestCase
            ((TestCase *)this,ctx->m_testCtx,(name->_M_dataplus)._M_p,
             (description->_M_dataplus)._M_p);
  (this->super_TestCase).m_context = ctx;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SeparateShaderTest_0219e498;
  iVar10 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar10),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SeparateShaderTest_0219e498;
  *(int *)&(this->super_CallLogWrapper).field_0x14 = iterations;
  this->m_currentIteration = 0;
  bVar19 = params->switchVtx;
  bVar18 = params->switchFrg;
  bVar1 = params->useUniform;
  bVar2 = params->useSameName;
  bVar3 = params->useCreateHelper;
  bVar4 = params->useProgramUniform;
  uVar5 = params->field_0x7;
  iVar10 = (params->varyings).count;
  DVar14 = (params->varyings).type;
  DVar6 = (params->varyings).type;
  BVar7 = (params->varyings).binding;
  VVar8 = (params->varyings).vtxInterp;
  VVar9 = (params->varyings).frgInterp;
  (this->m_params).initSingle = params->initSingle;
  (this->m_params).switchVtx = bVar19;
  (this->m_params).switchFrg = bVar18;
  (this->m_params).useUniform = bVar1;
  (this->m_params).useSameName = bVar2;
  (this->m_params).useCreateHelper = bVar3;
  (this->m_params).useProgramUniform = bVar4;
  (this->m_params).field_0x7 = uVar5;
  (this->m_params).varyings.count = iVar10;
  (this->m_params).varyings.type = DVar14;
  (this->m_params).varyings.type = DVar6;
  (this->m_params).varyings.binding = BVar7;
  (this->m_params).varyings.vtxInterp = VVar8;
  (this->m_params).varyings.frgInterp = VVar9;
  this->m_testFunc = testFunc;
  *(undefined8 *)&this->field_0xb8 = in_stack_00000010;
  rnd = &this->m_rnd;
  uVar11 = (((uint)params->useProgramUniform << 6 |
            (uint)params->useCreateHelper << 5 |
            (uint)params->useSameName << 4 |
            (uint)params->initSingle + (uint)params->switchVtx * 2 + (uint)params->switchFrg * 4 +
            (uint)params->useUniform * 8) ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  uVar11 = (uVar11 >> 0xf ^ uVar11) + (params->varyings).count;
  uVar11 = (uVar11 >> 0x10 ^ uVar11 ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  uVar11 = (uVar11 >> 0xf ^ uVar11) + (params->varyings).type;
  uVar11 = (uVar11 >> 0x10 ^ uVar11 ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  uVar11 = (uVar11 >> 0xf ^ uVar11) + (params->varyings).binding;
  uVar11 = (uVar11 >> 0x10 ^ uVar11 ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  uVar11 = (uVar11 >> 0xf ^ uVar11) + (params->varyings).vtxInterp;
  uVar11 = (uVar11 >> 0x10 ^ uVar11 ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  uVar11 = (uVar11 >> 0xf ^ uVar11) + (params->varyings).frgInterp;
  uVar11 = (uVar11 >> 0x10 ^ uVar11 ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  deRandom_init(&rnd->m_rnd,uVar11 >> 0xf ^ uVar11);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"// ","");
  tcu::ResultCollector::ResultCollector(&this->m_status,log,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  (this->m_varyings).frgInputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_varyings).frgInputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_varyings).vtxOutputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_varyings).frgInputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_varyings).vtxOutputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_varyings).vtxOutputs.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (params->varyings).count) {
    local_254 = 0;
    iVar10 = 0;
    do {
      local_26c = (params->varyings).binding;
      if (local_26c == BINDING_LAST) {
        dVar12 = deRandom_getBool(&rnd->m_rnd);
        local_26c = (BindingKind)(dVar12 == 1);
      }
      DVar14 = (params->varyings).type;
      if (DVar14 == TYPE_LAST) {
        dVar13 = deRandom_getUint32(&rnd->m_rnd);
        if ((dVar13 & 7) == 0) {
          dVar13 = deRandom_getUint32(&rnd->m_rnd);
          dVar15 = deRandom_getUint32(&rnd->m_rnd);
          DVar14 = glu::getDataTypeMatrix(dVar13 % 3 + 2,dVar15 % 3 + 2);
        }
        else {
          dVar13 = deRandom_getUint32(&rnd->m_rnd);
          DVar14 = de::Random::chooseWeighted<glu::DataType,glu::DataType_const*,float_const*>
                             (rnd,(DataType *)
                                  Functional::(anonymous_namespace)::randomType(de::Random&)::
                                  s_types,
                              (DataType *)
                              Functional::(anonymous_namespace)::randomType(de::Random&)::s_weights,
                              (float *)Functional::(anonymous_namespace)::randomType(de::Random&)::
                                       s_weights);
          DVar14 = glu::getDataTypeVector(DVar14,(dVar13 & 3) + 1);
        }
      }
      interpolation_ = chooseInterpolation((params->varyings).vtxInterp,DVar14,rnd);
      interpolation__00 = chooseInterpolation((params->varyings).frgInterp,DVar14,rnd);
      bVar19 = true;
      bVar18 = true;
      if ((interpolation_ != INTERPOLATION_SMOOTH) && (interpolation_ != INTERPOLATION_LAST)) {
        bVar18 = interpolation_ == INTERPOLATION_CENTROID;
      }
      if ((interpolation__00 != INTERPOLATION_SMOOTH) && (interpolation__00 != INTERPOLATION_LAST))
      {
        bVar19 = interpolation__00 == INTERPOLATION_CENTROID;
      }
      if (bVar18 != bVar19) {
        interpolation_ = interpolation__00;
      }
      location_ = -1;
      if (local_26c == BINDING_LOCATION) {
        location_ = local_254;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pcVar17 = "var";
      if (local_26c != BINDING_NAME) {
        pcVar17 = "vtxVar";
      }
      std::operator+(&local_1f8,pcVar17,&local_238);
      pcVar17 = "var";
      if (local_26c != BINDING_NAME) {
        pcVar17 = "frgVar";
      }
      std::operator+(&local_218,pcVar17,&local_238);
      glu::VarType::VarType(&local_1d8,DVar14,PRECISION_HIGHP);
      iVar16 = glu::getDataTypeNumLocations(DVar14);
      local_254 = local_254 + iVar16;
      if (0x10 < local_254) {
        glu::VarType::~VarType(&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        break;
      }
      glu::Layout::Layout(&local_1bc,location_,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      if (INTERPOLATION_CENTROID < interpolation_) {
        interpolation_ = INTERPOLATION_LAST;
      }
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_1a8,&local_1d8,&local_1f8,STORAGE_OUT,interpolation_,
                 &local_1bc,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>
                (&(this->m_varyings).vtxOutputs,(VariableDeclaration *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != local_158) {
        operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_188);
      glu::Layout::Layout(&local_1bc,location_,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      if (INTERPOLATION_CENTROID < interpolation__00) {
        interpolation__00 = INTERPOLATION_LAST;
      }
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_1a8,&local_1d8,&local_218,STORAGE_IN,interpolation__00
                 ,&local_1bc,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>
                (&(this->m_varyings).frgInputs,(VariableDeclaration *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != local_158) {
        operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_188);
      glu::VarType::~VarType(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (params->varyings).count);
  }
  (this->m_fullProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  (this->m_vtxProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  (this->m_frgProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  return;
}

Assistant:

SeparateShaderTest::SeparateShaderTest (Context&			ctx,
										const string&		name,
										const string&		description,
										int					iterations,
										const TestParams&	params,
										TestFunc			testFunc)
	: TestCase			(ctx, name.c_str(), description.c_str())
	, CallLogWrapper	(ctx.getRenderContext().getFunctions(), log())
	, m_iterations		(iterations)
	, m_currentIteration(0)
	, m_params			(params)
	, m_testFunc		(testFunc)
	, m_rnd				(paramsSeed(params))
	, m_status			(log(), "// ")
	, m_varyings		(genVaryingInterface(params.varyings, m_rnd))
{
	DE_ASSERT(paramsValid(params));
	DE_ASSERT(varyingsValid(m_varyings));
}